

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.h
# Opt level: O0

Expression * __thiscall
cnn::ClassFactoredSoftmaxBuilder::get_rc2w(ClassFactoredSoftmaxBuilder *this,uint cluster_idx)

{
  ComputationGraph *g;
  uint in_ESI;
  Expression *in_RDI;
  Expression *e;
  ComputationGraph *pCVar1;
  Parameters *in_stack_ffffffffffffffe0;
  
  g = (ComputationGraph *)
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 &in_RDI[0x13].i,(ulong)in_ESI);
  if ((ComputationGraph *)
      (g->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start == (ComputationGraph *)0x0) {
    pCVar1 = in_RDI[0x11].pg;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
              ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)(in_RDI + 0xe),
               (ulong)in_ESI);
    cnn::expr::parameter(g,in_stack_ffffffffffffffe0);
    cnn::expr::Expression::operator=(in_RDI,(Expression *)pCVar1);
  }
  return (Expression *)g;
}

Assistant:

inline expr::Expression& get_rc2w(unsigned cluster_idx) {
    expr::Expression& e = rc2ws[cluster_idx];
    if (!e.pg)
      e = expr::parameter(*pcg, p_rc2ws[cluster_idx]);
    return e;
  }